

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

BroadcastToDynamicLayerParams * __thiscall
CoreML::Specification::BroadcastToDynamicLayerParams::New
          (BroadcastToDynamicLayerParams *this,Arena *arena)

{
  BroadcastToDynamicLayerParams *this_00;
  
  this_00 = (BroadcastToDynamicLayerParams *)operator_new(0x18);
  BroadcastToDynamicLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::BroadcastToDynamicLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

BroadcastToDynamicLayerParams* BroadcastToDynamicLayerParams::New(::google::protobuf::Arena* arena) const {
  BroadcastToDynamicLayerParams* n = new BroadcastToDynamicLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}